

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O1

void __thiscall
irr::scene::CSkinnedMesh::calculateTangents
          (CSkinnedMesh *this,vector3df *normal,vector3df *tangent,vector3df *binormal,
          vector3df *vt1,vector3df *vt2,vector3df *vt3,vector2df *tc1,vector2df *tc2,vector2df *tc3)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar3;
  ulong uVar4;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  fVar7 = vt3->X - vt1->X;
  uVar1 = vt1->Y;
  uVar5 = vt1->Z;
  uVar2 = vt3->Y;
  uVar6 = vt3->Z;
  fVar13 = (float)uVar2 - (float)uVar1;
  fVar14 = (float)uVar6 - (float)uVar5;
  fVar8 = (float)uVar1 - vt2->Y;
  fVar11 = (float)uVar5 - vt2->Z;
  fVar12 = vt1->X - vt2->X;
  normal->X = fVar13 * fVar11 - fVar8 * fVar14;
  normal->Y = fVar14 * fVar12 - fVar11 * fVar7;
  normal->Z = fVar7 * fVar8 - fVar12 * fVar13;
  core::vector3d<float>::normalize(normal);
  fVar10 = tc3->X - tc1->X;
  fVar9 = tc1->X - tc2->X;
  binormal->X = fVar12 * fVar10 - fVar7 * fVar9;
  binormal->Y = fVar8 * fVar10 - fVar13 * fVar9;
  binormal->Z = fVar10 * fVar11 - fVar9 * fVar14;
  core::vector3d<float>::normalize(binormal);
  fVar10 = tc3->Y - tc1->Y;
  fVar9 = tc1->Y - tc2->Y;
  tangent->X = fVar12 * fVar10 - fVar7 * fVar9;
  tangent->Y = fVar8 * fVar10 - fVar13 * fVar9;
  tangent->Z = fVar10 * fVar11 - fVar9 * fVar14;
  core::vector3d<float>::normalize(tangent);
  fVar7 = tangent->Z;
  uVar3._0_4_ = tangent->X;
  uVar3._4_4_ = tangent->Y;
  if ((binormal->Y * (float)(undefined4)uVar3 - (float)uVar3._4_4_ * binormal->X) * normal->Z +
      ((float)uVar3._4_4_ * binormal->Z - binormal->Y * fVar7) * normal->X +
      (fVar7 * binormal->X - binormal->Z * (float)(undefined4)uVar3) * normal->Y < 0.0) {
    tangent->X = (float)(int)(uVar3 ^ 0x8000000080000000);
    tangent->Y = (float)(int)((uVar3 ^ 0x8000000080000000) >> 0x20);
    tangent->Z = -fVar7;
    uVar4._0_4_ = binormal->X;
    uVar4._4_4_ = binormal->Y;
    binormal->X = (float)(int)(uVar4 ^ 0x8000000080000000);
    binormal->Y = (float)(int)((uVar4 ^ 0x8000000080000000) >> 0x20);
    binormal->Z = -binormal->Z;
  }
  return;
}

Assistant:

void CSkinnedMesh::calculateTangents(
		core::vector3df &normal,
		core::vector3df &tangent,
		core::vector3df &binormal,
		const core::vector3df &vt1, const core::vector3df &vt2, const core::vector3df &vt3, // vertices
		const core::vector2df &tc1, const core::vector2df &tc2, const core::vector2df &tc3) // texture coords
{
	core::vector3df v1 = vt1 - vt2;
	core::vector3df v2 = vt3 - vt1;
	normal = v2.crossProduct(v1);
	normal.normalize();

	// binormal

	f32 deltaX1 = tc1.X - tc2.X;
	f32 deltaX2 = tc3.X - tc1.X;
	binormal = (v1 * deltaX2) - (v2 * deltaX1);
	binormal.normalize();

	// tangent

	f32 deltaY1 = tc1.Y - tc2.Y;
	f32 deltaY2 = tc3.Y - tc1.Y;
	tangent = (v1 * deltaY2) - (v2 * deltaY1);
	tangent.normalize();

	// adjust

	core::vector3df txb = tangent.crossProduct(binormal);
	if (txb.dotProduct(normal) < 0.0f) {
		tangent *= -1.0f;
		binormal *= -1.0f;
	}
}